

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::copyMaterials(OpenGEXImporter *this,aiScene *pScene)

{
  pointer ppaVar1;
  pointer ppaVar2;
  ulong uVar3;
  aiMaterial **__dest;
  size_t __n;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x4a6,"void Assimp::OpenGEX::OpenGEXImporter::copyMaterials(aiScene *)");
  }
  ppaVar1 = (this->m_materialCache).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppaVar2 = (this->m_materialCache).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppaVar1 != ppaVar2) {
    uVar3 = (long)ppaVar2 - (long)ppaVar1;
    pScene->mNumMaterials = (uint)(uVar3 >> 3);
    __dest = (aiMaterial **)operator_new__(uVar3 & 0x7fffffff8);
    pScene->mMaterials = __dest;
    ppaVar1 = (this->m_materialCache).
              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __n = (long)(this->m_materialCache).
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppaVar1;
    if (__n != 0) {
      memmove(__dest,ppaVar1,__n);
      return;
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::copyMaterials( aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( m_materialCache.empty() ) {
        return;
    }

    pScene->mNumMaterials = static_cast<unsigned int>(m_materialCache.size());
    pScene->mMaterials = new aiMaterial*[ pScene->mNumMaterials ];
    std::copy( m_materialCache.begin(), m_materialCache.end(), pScene->mMaterials );
}